

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

long __thiscall
gl4cts::anon_unknown_0::AdvancedUnsizedArrayLength2::Cleanup(AdvancedUnsizedArrayLength2 *this)

{
  AdvancedUnsizedArrayLength2 *this_local;
  
  glu::CallLogWrapper::glUseProgram
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_program);
  glu::CallLogWrapper::glDeleteBuffers
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,8,this->m_storage_buffer);
  if (this->stage != 2) {
    glu::CallLogWrapper::glDeleteVertexArrays
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->m_vertex_array);
  }
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glUseProgram(0);
		glDeleteProgram(m_program);
		glDeleteBuffers(8, m_storage_buffer);
		if (stage != compute)
			glDeleteVertexArrays(1, &m_vertex_array);
		return NO_ERROR;
	}